

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

QIBusPropTypeContentType qvariant_cast<QIBusPropTypeContentType>(QVariant *v)

{
  bool bVar1;
  QMetaType QVar2;
  PrivateShared *pPVar3;
  long in_FS_OFFSET;
  QIBusPropTypeContentType t;
  QMetaType local_30;
  QMetaType local_28;
  QIBusPropTypeContentType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QIBusPropTypeContentType>::metaType;
  local_30.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
  bVar1 = comparesEqual(&local_30,&local_28);
  if (bVar1) {
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar3 = (v->d).data.shared;
      v = (QVariant *)(pPVar3 + *(int *)(pPVar3 + 4));
    }
  }
  else {
    local_20.purpose = 0xaaaaaaaa;
    local_20.hints = 0xaaaaaaaa;
    QVar2.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    pPVar3 = (PrivateShared *)v;
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar3 = (v->d).data.shared;
      pPVar3 = pPVar3 + *(int *)(pPVar3 + 4);
    }
    v = (QVariant *)&local_20;
    QMetaType::convert(QVar2,pPVar3,local_28,v);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return *(QIBusPropTypeContentType *)v;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}